

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::async_list_tabpages(Nvim *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"nvim_list_tabpages",&local_31);
  NvimRPC::async_call<>(&this->client_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Nvim::async_list_tabpages() {
    client_.async_call("nvim_list_tabpages");
}